

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlink-ipi.c
# Opt level: O3

mraa_result_t pwm_enable_replace(mraa_pwm_context dev,int enable)

{
  mraa_result_t mVar1;
  ssize_t sVar2;
  undefined8 uStack_8;
  
  mVar1 = MRAA_ERROR_NO_RESOURCES;
  if ((((ulong)(uint)dev->pin < 9) && (_fd != -1)) && (mVar1 = MRAA_ERROR_NO_RESOURCES, _fd != -1))
  {
    uStack_8._0_7_ = CONCAT16(0xff,CONCAT15("*-036;@EJMPSV[`e"[(uint)dev->pin],6));
    uStack_8 = (ulong)(uint7)uStack_8;
    sVar2 = write(_fd,(void *)((long)&uStack_8 + 5),2);
    mVar1 = MRAA_ERROR_NO_RESOURCES;
    if (sVar2 == 2) {
      mVar1 = MRAA_SUCCESS;
    }
  }
  return mVar1;
}

Assistant:

static mraa_result_t pwm_enable_replace(mraa_pwm_context dev, int enable)
{
	int pin = dev->pin;

	if(9 > pin && 0 <= pin)
	{
		if(_fd != -1)
		{
			unsigned char rx_tx_buf[3] = {0};

			if(_fd == -1)
			{
				return MRAA_ERROR_NO_RESOURCES;
			}

			rx_tx_buf[0] = regIon[pin];
			rx_tx_buf[1] = 0xFF;
			if(write(_fd, &(rx_tx_buf[0]), 2) != 2)
			{
				return MRAA_ERROR_NO_RESOURCES;
			}
		}
		else
		{
			return MRAA_ERROR_NO_RESOURCES;
		}

		return MRAA_SUCCESS;
	}
	return MRAA_ERROR_NO_RESOURCES;
}